

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void pnga_median_patch(Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,
                      Integer g_c,Integer *clo,Integer *chi,Integer g_m,Integer *mlo,Integer *mhi)

{
  bool bVar1;
  Integer *ahi_00;
  int iVar2;
  Integer IVar3;
  Integer IVar4;
  Integer IVar5;
  Integer IVar6;
  logical lVar7;
  Integer IVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  char transp;
  Integer mndim;
  Integer local_1108;
  Integer g_C;
  Integer g_B;
  Integer g_A;
  Integer cndim;
  Integer bndim;
  Integer andim;
  Integer local_10d0;
  Integer local_10c8;
  Integer *local_10c0;
  char *A_ptr;
  Integer type;
  char *C_ptr;
  char *B_ptr;
  Integer mtype;
  int local_108c;
  char *M_ptr;
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer loM [7];
  Integer hiM [7];
  Integer hiA [7];
  Integer loA [7];
  Integer hiC [7];
  Integer loC [7];
  Integer hiB [7];
  Integer loB [7];
  Integer lod [7];
  Integer ldM [7];
  Integer ldA [7];
  Integer ldC [7];
  Integer ldB [7];
  Integer mdims [7];
  Integer cdims [7];
  Integer bdims [7];
  Integer adims [7];
  Integer compatible;
  _iterator_hdl hdl_m;
  _iterator_hdl hdl_c;
  _iterator_hdl hdl_b;
  
  g_C = g_c;
  local_1108 = g_b;
  g_B = g_b;
  g_A = g_a;
  local_10d0 = g_a;
  local_10c0 = bhi;
  local_10c8 = pnga_nodeid();
  type = 0x7d05;
  transp = 'n';
  bVar14 = _ga_sync_begin != 0;
  local_108c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar14) {
    pnga_sync();
  }
  pnga_inquire(local_10d0,&atype,&andim,adims);
  pnga_inquire(local_1108,&btype,&bndim,bdims);
  pnga_inquire(g_c,&ctype,&cndim,cdims);
  pnga_inquire(g_m,&mtype,&mndim,mdims);
  pnga_inquire(g_m,&type,&mndim,mdims);
  if (mtype != atype) {
    pnga_error(" pnga_median_patch:type mismatch ",0);
  }
  if (mtype != btype) {
    pnga_error(" pnga_median_patch:type mismatch ",0);
  }
  if (mtype != ctype) {
    pnga_error(" pnga_median_patch:type mismatch ",0);
  }
  if (0 < andim) {
    lVar11 = 0;
    do {
      if ((alo[lVar11] < 1) || (adims[lVar11] < ahi[lVar11])) {
        pnga_error("pnga_median_patch: g_a indices out of range ",local_10d0);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < andim);
  }
  if (0 < bndim) {
    lVar11 = 0;
    do {
      if ((blo[lVar11] < 1) || (bdims[lVar11] < local_10c0[lVar11])) {
        pnga_error("pnga_median_patch:g_b indices out of range ",local_1108);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < bndim);
  }
  if (0 < cndim) {
    lVar11 = 0;
    do {
      if ((clo[lVar11] < 1) || (cdims[lVar11] < chi[lVar11])) {
        pnga_error("pnga_median_patch:g_c indices out of range ",g_c);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < cndim);
  }
  if (0 < mndim) {
    lVar11 = 0;
    do {
      if ((mlo[lVar11] < 1) || (mdims[lVar11] < mhi[lVar11])) {
        pnga_error("pnga_median_patch:g_m indices out of range ",g_m);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < mndim);
  }
  lVar13 = 1;
  lVar11 = 1;
  if (0 < andim) {
    lVar9 = 0;
    do {
      lVar11 = lVar11 * ((ahi[lVar9] - alo[lVar9]) + 1);
      lVar9 = lVar9 + 1;
    } while (andim != lVar9);
  }
  if (0 < bndim) {
    lVar13 = 1;
    lVar9 = 0;
    do {
      lVar13 = lVar13 * ((local_10c0[lVar9] - blo[lVar9]) + 1);
      lVar9 = lVar9 + 1;
    } while (bndim != lVar9);
  }
  lVar12 = 1;
  lVar9 = 1;
  if (0 < cndim) {
    lVar10 = 0;
    do {
      lVar9 = lVar9 * ((chi[lVar10] - clo[lVar10]) + 1);
      lVar10 = lVar10 + 1;
    } while (cndim != lVar10);
  }
  if (0 < mndim) {
    lVar12 = 1;
    lVar10 = 0;
    do {
      lVar12 = lVar12 * ((mhi[lVar10] - mlo[lVar10]) + 1);
      lVar10 = lVar10 + 1;
    } while (mndim != lVar10);
  }
  if (lVar12 != lVar11) {
    pnga_error("pnga_median_patch:  capacities of patches do not match ",0);
  }
  if (lVar12 != lVar13) {
    pnga_error("pnga_median_patch:  capacities of patches do not match ",0);
  }
  if (lVar12 != lVar9) {
    pnga_error("pnga_median_patch:  capacities of patches do not match ",0);
  }
  IVar3 = pnga_total_blocks(local_10d0);
  IVar4 = pnga_total_blocks(local_1108);
  IVar5 = pnga_total_blocks(g_c);
  IVar6 = pnga_total_blocks(g_m);
  IVar8 = local_10c8;
  if ((((IVar3 < 0) && (IVar4 < 0)) && (IVar5 < 0)) && (IVar6 < 0)) {
    pnga_distribution(g_A,local_10c8,loA,hiA);
    pnga_distribution(g_B,IVar8,loB,hiB);
    pnga_distribution(g_C,IVar8,loC,hiC);
    pnga_distribution(g_m,IVar8,loM,hiM);
    lVar7 = pnga_comp_patch(andim,loA,hiA,mndim,loM,hiM);
    compatible = (Integer)(lVar7 == 0);
    IVar8 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar8,&compatible,1,"&&");
    if (compatible == 0) {
      lVar7 = pnga_duplicate(g_m,&g_A,"temp");
      if (lVar7 == 0) {
        pnga_error("pnga_median_patch:duplicate failed",0);
      }
      pnga_copy_patch(&transp,local_10d0,alo,ahi,g_A,mlo,mhi);
      andim = mndim;
      pnga_distribution(g_A,local_10c8,loA,hiA);
      bVar14 = true;
    }
    else {
      bVar14 = false;
    }
    lVar7 = pnga_comp_patch(bndim,loB,hiB,mndim,loM,hiM);
    compatible = (Integer)(lVar7 == 0);
    IVar8 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar8,&compatible,1,"&&");
    if (compatible == 0) {
      lVar7 = pnga_duplicate(g_m,&g_B,"temp");
      if (lVar7 == 0) {
        pnga_error("pnga_median_patch:duplicate failed",0);
      }
      pnga_copy_patch(&transp,local_1108,blo,local_10c0,g_B,mlo,mhi);
      bndim = mndim;
      pnga_distribution(g_B,local_10c8,loB,hiB);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    lVar7 = pnga_comp_patch(cndim,loC,hiC,mndim,loM,hiM);
    compatible = (Integer)(lVar7 == 0);
    IVar8 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar8,&compatible,1,"&&");
    if (compatible == 0) {
      lVar7 = pnga_duplicate(g_m,&g_C,"temp");
      if (lVar7 == 0) {
        pnga_error("pnga_median_patch:duplicate failed",0);
      }
      cndim = mndim;
      pnga_copy_patch(&transp,g_c,clo,chi,g_C,mlo,mhi);
      pnga_distribution(g_C,local_10c8,loC,hiC);
      local_1108 = 1;
    }
    else {
      local_1108 = 0;
    }
    lVar7 = pnga_comp_patch(mndim,loM,hiM,andim,loA,hiA);
    if (lVar7 == 0) {
      pnga_error(" patches mismatch ",0);
    }
    lVar7 = pnga_comp_patch(mndim,loM,hiM,bndim,loB,hiB);
    if (lVar7 == 0) {
      pnga_error(" patches mismatch ",0);
    }
    lVar7 = pnga_comp_patch(mndim,loM,hiM,cndim,loC,hiC);
    if (lVar7 == 0) {
      pnga_error(" patches mismatch ",0);
    }
    if (andim < mndim) {
      mndim = andim;
    }
    if (bndim < mndim) {
      mndim = bndim;
    }
    if (cndim < mndim) {
      mndim = cndim;
    }
    lVar7 = pnga_patch_intersect(mlo,mhi,loM,hiM,mndim);
    if (lVar7 != 0) {
      pnga_access_ptr(g_A,loM,hiM,&A_ptr,ldA);
      pnga_access_ptr(g_B,loM,hiM,&B_ptr,ldB);
      pnga_access_ptr(g_C,loM,hiM,&C_ptr,ldC);
      pnga_access_ptr(g_m,loM,hiM,&M_ptr,ldM);
      sgai_median_patch_values(type,mndim,loM,hiM,ldM,A_ptr,B_ptr,C_ptr,M_ptr,0);
      pnga_release(g_A,loM,hiM);
      pnga_release(g_B,loM,hiM);
      pnga_release(g_C,loM,hiM);
      pnga_release_update(g_m,loM,hiM);
    }
  }
  else {
    lVar7 = pnga_duplicate(g_m,&g_A,"temp");
    if (lVar7 == 0) {
      pnga_error("ga_add_patch: dup failed",0);
    }
    pnga_copy_patch(&transp,local_10d0,alo,ahi,g_A,mlo,mhi);
    andim = mndim;
    lVar7 = pnga_duplicate(g_m,&g_B,"temp");
    ahi_00 = local_10c0;
    if (lVar7 == 0) {
      pnga_error("ga_add_patch: dup failed",0);
    }
    pnga_copy_patch(&transp,local_1108,blo,ahi_00,g_B,mlo,mhi);
    bndim = mndim;
    lVar7 = pnga_duplicate(g_m,&g_C,"temp");
    if (lVar7 == 0) {
      pnga_error("ga_add_patch: dup failed",0);
    }
    pnga_copy_patch(&transp,g_c,clo,chi,g_C,mlo,mhi);
    cndim = mndim;
    pnga_local_iterator_init(g_A,(_iterator_hdl *)&compatible);
    pnga_local_iterator_init(g_B,&hdl_b);
    pnga_local_iterator_init(g_C,&hdl_c);
    pnga_local_iterator_init(g_m,&hdl_m);
    iVar2 = pnga_local_iterator_next((_iterator_hdl *)&compatible,loA,hiA,&A_ptr,ldA);
    if (iVar2 == 0) {
      local_1108 = 1;
      bVar1 = true;
      bVar14 = true;
    }
    else {
      bVar1 = true;
      do {
        pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);
        pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC);
        pnga_local_iterator_next(&hdl_m,loM,hiM,&M_ptr,ldM);
        IVar8 = mndim;
        if (0 < mndim) {
          memcpy(lod,loM,mndim * 8);
        }
        lVar11 = 1;
        local_1108 = 1;
        if (IVar8 < 2) {
          lVar13 = 0;
        }
        else {
          lVar9 = 0;
          lVar13 = 0;
          do {
            lVar13 = lVar13 + (loM[lVar9] - lod[lVar9]) * lVar11;
            lVar11 = lVar11 * ldM[lVar9];
            lVar9 = lVar9 + 1;
          } while (IVar8 + -1 != lVar9);
        }
        sgai_median_patch_values
                  (type,IVar8,loM,hiM,ldM,A_ptr,B_ptr,C_ptr,M_ptr,
                   (loM[IVar8 + -1] - lod[IVar8 + -1]) * lVar11 + lVar13);
        iVar2 = pnga_local_iterator_next((_iterator_hdl *)&compatible,loA,hiA,&A_ptr,ldA);
        bVar14 = true;
      } while (iVar2 != 0);
    }
  }
  if (bVar14) {
    pnga_destroy(g_A);
  }
  if (bVar1) {
    pnga_destroy(g_B);
  }
  if (local_1108 != 0) {
    pnga_destroy(g_C);
  }
  if (local_108c != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_median_patch(
        g_a, alo, ahi, g_b, blo, bhi, g_c, clo, chi, g_m, mlo, mhi)
     Integer g_a, *alo, *ahi;  /* patch of g_a */
     Integer g_b, *blo, *bhi;  /* patch of g_b */
     Integer g_c, *clo, *chi;  /* patch of g_c */
     Integer g_m, *mlo, *mhi;  /* patch of g_m */
{
  Integer i, j;
  Integer atype, btype, andim, adims[MAXDIM], bndim, bdims[MAXDIM];
  Integer ctype, mtype, cndim, cdims[MAXDIM], mndim, mdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer loC[MAXDIM], hiC[MAXDIM], ldC[MAXDIM];
  Integer loM[MAXDIM], hiM[MAXDIM], ldM[MAXDIM];
  Integer g_A = g_a, g_B = g_b;
  Integer g_C = g_c, g_M = g_m;
  char *A_ptr, *B_ptr;
  char *C_ptr, *M_ptr;
  Integer offset;
  Integer atotal, btotal;
  Integer ctotal, mtotal;
  Integer me = pnga_nodeid (), a_temp_created = 0, b_temp_created = 0, c_temp_created = 0;
  Integer type = GA_TYPE_GSM, compatible;
  char *tempname = "temp", transp = 'n';        /*no transpose */
  Integer num_blocks_a, num_blocks_b, num_blocks_c, num_blocks_m;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl_a, hdl_b, hdl_c, hdl_m;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire (g_a, &atype, &andim, adims);
  pnga_inquire (g_b, &btype, &bndim, bdims);
  pnga_inquire (g_c, &ctype, &cndim, cdims);
  pnga_inquire (g_m, &mtype, &mndim, mdims);

  /* I have to inquire the data type again since nga_inquire and
   * nga_inquire_internal_ treat data type differently */
  pnga_inquire(g_m, &type, &mndim, mdims);

  if (mtype != atype)
    pnga_error(" pnga_median_patch:type mismatch ", 0L);
  if (mtype != btype)
    pnga_error(" pnga_median_patch:type mismatch ", 0L);
  if (mtype != ctype)
    pnga_error(" pnga_median_patch:type mismatch ", 0L);

  /* check if patch indices and g_a dims match */
  for (i = 0; i < andim; i++)
    if (alo[i] <= 0 || ahi[i] > adims[i])
    {
      pnga_error("pnga_median_patch: g_a indices out of range ", g_a);
    }

  for (i = 0; i < bndim; i++)
    if (blo[i] <= 0 || bhi[i] > bdims[i])
    {
      pnga_error("pnga_median_patch:g_b indices out of range ", g_b);
    }

  for (i = 0; i < cndim; i++)
    if (clo[i] <= 0 || chi[i] > cdims[i])
    {
      pnga_error("pnga_median_patch:g_c indices out of range ", g_c);
    }         
  for (i = 0; i < mndim; i++)
    if (mlo[i] <= 0 || mhi[i] > mdims[i])
    {
      pnga_error("pnga_median_patch:g_m indices out of range ", g_m);
    }

  /* check if numbers of elements in two patches match each other */

  atotal = 1;
  for (i = 0; i < andim; i++)
    atotal *= (ahi[i] - alo[i] + 1);

  btotal = 1;
  for (i = 0; i < bndim; i++)
    btotal *= (bhi[i] - blo[i] + 1);

  ctotal = 1;
  for (i = 0; i < cndim; i++)
    ctotal *= (chi[i] - clo[i] + 1);

  mtotal = 1;
  for (i = 0; i < mndim; i++)
    mtotal *= (mhi[i] - mlo[i] + 1);


  if (mtotal != atotal)
    pnga_error("pnga_median_patch:  capacities of patches do not match ", 0L);

  if (mtotal != btotal)
    pnga_error("pnga_median_patch:  capacities of patches do not match ", 0L);

  if (mtotal != ctotal)
    pnga_error("pnga_median_patch:  capacities of patches do not match ", 0L);

  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  num_blocks_c = pnga_total_blocks(g_c);
  num_blocks_m = pnga_total_blocks(g_m);

  if (num_blocks_a < 0 && num_blocks_b < 0 &&
      num_blocks_c < 0 && num_blocks_m < 0) {
    /* find out coordinates of patches of g_A, g_B, g_C, and g_M that I own */
    pnga_distribution (g_A, me, loA, hiA);
    pnga_distribution (g_B, me, loB, hiB);
    pnga_distribution (g_C, me, loC, hiC);
    pnga_distribution (g_M, me, loM, hiM);

    if (!pnga_comp_patch (andim, loA, hiA, mndim, loM, hiM)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if (!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_a
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_m, &g_A, tempname))
        pnga_error("pnga_median_patch:duplicate failed", 0L);

      pnga_copy_patch(&transp, g_a, alo, ahi, g_A, mlo, mhi);
      andim = mndim;
      a_temp_created = 1;
      pnga_distribution (g_A, me, loA, hiA);
    }

    if (!pnga_comp_patch (bndim, loB, hiB, mndim, loM, hiM)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if (!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_a
       *        - copy & reshape patch of g_c into g_C
       */
      if (!pnga_duplicate(g_m, &g_B, tempname))
        pnga_error("pnga_median_patch:duplicate failed", 0L);

      pnga_copy_patch(&transp, g_b, blo, bhi, g_B, mlo, mhi);
      bndim = mndim;
      b_temp_created = 1;
      pnga_distribution (g_B, me, loB, hiB);
    }

    if (!pnga_comp_patch (cndim, loC, hiC, mndim, loM, hiM)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if (!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_a
       *        - copy & reshape patch of g_m into g_M
       */
      if (!pnga_duplicate(g_m, &g_C, tempname))
        pnga_error("pnga_median_patch:duplicate failed", 0L);

      /*no need to copy g_m since it is the output matrix. */
      cndim = mndim;
      c_temp_created = 1;
      pnga_copy_patch(&transp, g_c, clo, chi, g_C, mlo, mhi);
      pnga_distribution (g_C, me, loC, hiC);
    }


    if (!pnga_comp_patch (mndim, loM, hiM, andim, loA, hiA))
      pnga_error(" patches mismatch ", 0);
    if (!pnga_comp_patch (mndim, loM, hiM, bndim, loB, hiB))
      pnga_error(" patches mismatch ", 0);
    if (!pnga_comp_patch (mndim, loM, hiM, cndim, loC, hiC))
      pnga_error(" patches mismatch ", 0);


    /* A[83:125,1:1]  <==> B[83:125] */
    if (mndim > andim)
      mndim = andim;            /* need more work */
    if (mndim > bndim)
      mndim = bndim;            /* need more work */
    if (mndim > cndim)
      mndim = cndim;            /* need more work */


    /*  determine subsets of my patches to access  */
    if (pnga_patch_intersect (mlo, mhi, loM, hiM, mndim)) {
      offset = 0;
      pnga_access_ptr (g_A, loM, hiM, &A_ptr, ldA);
      pnga_access_ptr (g_B, loM, hiM, &B_ptr, ldB);
      pnga_access_ptr (g_C, loM, hiM, &C_ptr, ldC);
      pnga_access_ptr (g_M, loM, hiM, &M_ptr, ldM);

      sgai_median_patch_values(type, mndim, loM, hiM, ldM,
          A_ptr, B_ptr, C_ptr, M_ptr, offset);

      /* release access to the data */
      pnga_release (g_A, loM, hiM);
      pnga_release (g_B, loM, hiM);
      pnga_release (g_C, loM, hiM);
      pnga_release_update (g_M, loM, hiM);
    }
  } else {
    /* create copies of A, B, and C that are identically distributed
       as M */
    if (!pnga_duplicate(g_m, &g_A, tempname))
      pnga_error("ga_add_patch: dup failed", 0L);
    pnga_copy_patch(&transp, g_a, alo, ahi, g_A, mlo, mhi);
    andim = mndim;
    a_temp_created = 1;

    if (!pnga_duplicate(g_m, &g_B, tempname))
      pnga_error("ga_add_patch: dup failed", 0L);
    pnga_copy_patch(&transp, g_b, blo, bhi, g_B, mlo, mhi);
    bndim = mndim;
    b_temp_created = 1;

    if (!pnga_duplicate(g_m, &g_C, tempname))
      pnga_error("ga_add_patch: dup failed", 0L);
        pnga_copy_patch(&transp, g_c, clo, chi, g_C, mlo, mhi);
    cndim = mndim;
    c_temp_created = 1;

    /* M is normally distributed so just get the mean using standard approach */
#if 1
    pnga_local_iterator_init(g_A, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    pnga_local_iterator_init(g_C, &hdl_c);
    pnga_local_iterator_init(g_m, &hdl_m);
    while(pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA)) {
      pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);
      pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC);
      pnga_local_iterator_next(&hdl_m,loM,hiM,&M_ptr,ldM);
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer jtot, last;
      /* make temporary copies of loM and hiM since pnga_patch_intersect
         destroys original versions */
      for (j=0; j<mndim; j++) {
        lod[j] = loM[j];
        /*hid[j] = hiM[j];*/
      }

      /* evaluate offsets for system */
      offset = 0;
      last = mndim - 1;
      jtot = 1;
      for (j=0; j<last; j++) {
        offset += (loM[j] - lod[j])*jtot;
        jtot *= ldM[j];
      }
      offset += (loM[last]-lod[last])*jtot;

      sgai_median_patch_values(type, mndim, loM, hiM, ldM,
          A_ptr, B_ptr, C_ptr, M_ptr, offset);

    }
#else
    if (num_blocks_m < 0) {
      offset = 0;
      pnga_distribution(g_m, me, loM, hiM);
      if (pnga_patch_intersect (mlo, mhi, loM, hiM, mndim)) {
        pnga_access_ptr (g_A, loM, hiM, &A_ptr, ldA);
        pnga_access_ptr (g_B, loM, hiM, &B_ptr, ldB);
        pnga_access_ptr (g_C, loM, hiM, &C_ptr, ldC);
        pnga_access_ptr (g_M, loM, hiM, &M_ptr, ldM);

        sgai_median_patch_values(type, mndim, loM, hiM, ldM,
            A_ptr, B_ptr, C_ptr, M_ptr, offset);

        /* release access to the data */
        pnga_release (g_A, loM, hiM);
        pnga_release (g_B, loM, hiM);
        pnga_release (g_C, loM, hiM);
        pnga_release_update (g_M, loM, hiM);
      }
    } else {
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer jtot, last, nproc;
      /* Simple block-cyclic data distribution */
      if (!pnga_uses_proc_grid(g_m)) {
        nproc = pnga_nnodes();
        for (idx = me; idx < num_blocks_m; idx += nproc) {
          pnga_distribution(g_m, idx, loM, hiM);
          /* make temporary copies of loM and hiM since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<mndim; j++) {
            lod[j] = loM[j];
            /*hid[j] = hiM[j];*/
          }
          if (pnga_patch_intersect(mlo, mhi, loM, hiM, mndim)) {
            pnga_access_block_ptr(g_A, idx, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, idx, &B_ptr, ldB);
            pnga_access_block_ptr(g_C, idx, &C_ptr, ldC);
            pnga_access_block_ptr(g_m, idx, &M_ptr, ldM);

            /* evaluate offsets for system */
            offset = 0;
            last = mndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loM[j] - lod[j])*jtot;
              jtot *= ldM[j];
            }
            offset += (loM[last]-lod[last])*jtot;

            sgai_median_patch_values(type, mndim, loM, hiM, ldM,
                A_ptr, B_ptr, C_ptr, M_ptr, offset);

            /* release access to the data */
            pnga_release_block (g_A, idx);
            pnga_release_block (g_B, idx);
            pnga_release_block (g_C, idx);
            pnga_release_update_block (g_M, idx);
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer lod[MAXDIM]/*, hid[MAXDIM], chk*/;
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_m, me, proc_index);
        pnga_get_proc_index(g_m, me, index);
        pnga_get_block_info(g_m, blocks, block_dims);
        pnga_get_proc_grid(g_m, topology);

        while (index[mndim-1] < blocks[mndim-1]) {
          /* find bounding coordinates of block */
          /*chk = 1;*/
          for (i = 0; i < mndim; i++) {
            loM[i] = index[i]*block_dims[i]+1;
            hiM[i] = (index[i] + 1)*block_dims[i];
            if (hiM[i] > mdims[i]) hiM[i] = mdims[i];
            /*if (hiM[i] < loM[i]) chk = 0;*/
          }
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<mndim; j++) {
            lod[j] = loM[j];
            /*hid[j] = hiM[j];*/
          }
          if (pnga_patch_intersect(mlo, mhi, loM, hiM, mndim)) {
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);
            pnga_access_block_grid_ptr(g_C, index, &C_ptr, ldC);
            pnga_access_block_grid_ptr(g_m, index, &M_ptr, ldM);

            /* evaluate offsets for system */
            offset = 0;
            last = mndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loM[j] - lod[j])*jtot;
              jtot *= ldM[j];
            }
            offset += (loM[last]-lod[last])*jtot;

            sgai_median_patch_values(type, mndim, loM, hiM, ldM,
                A_ptr, B_ptr, C_ptr, M_ptr, offset);

            /* release access to the data */
            pnga_release_block_grid (g_A, index);
            pnga_release_block_grid (g_B, index);
            pnga_release_block_grid (g_C, index);
            pnga_release_update_block_grid (g_M, index);
          }

          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < mndim; i++) {
            if (index[i] >= blocks[i] && i<mndim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }
  if (a_temp_created)
    pnga_destroy (g_A);
  if (b_temp_created)
    pnga_destroy (g_B);
  if (c_temp_created)
    pnga_destroy (g_C);
  if(local_sync_end)pnga_sync();
}